

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_simul.c
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *__stream;
  ulong uVar1;
  int *piVar2;
  char *pcVar3;
  ulong local_28;
  uint64_t nvalid;
  param_t *p;
  char **argv_local;
  int argc_local;
  
  parse_args(argv + 1);
  if (n_threads == 0) {
    uVar1 = sysconf(0x54);
    n_threads = uVar1 & 0xffffffff;
    if (0x1000 < n_threads) {
      n_threads = 0x1000;
    }
    if (n_threads == 0) {
      fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
              "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/benchmarks/bench_simul.c"
              ,0x2ac,"main");
      fprintf(_stderr,"can\'t obtain number of processor cores");
      fprintf(_stderr,"\n");
      abort();
    }
  }
  if (max_size < min_size) {
    fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
            "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/benchmarks/bench_simul.c"
            ,0x2b0,"main");
    fprintf(_stderr,"min_size > max_size");
    fprintf(_stderr,"\n");
    abort();
  }
  printf("Parameters:\n  %-20s : %s\n","dir",dir);
  for (nvalid = (uint64_t)params; *(long *)nvalid != 0; nvalid = nvalid + 0x28) {
    if (*(long *)(nvalid + 8) != 0) {
      printf("  %-20s : ",*(undefined8 *)nvalid);
      if (*(long *)(nvalid + 0x20) == 0) {
        print_units(**(uint64_t **)(nvalid + 8));
      }
      else {
        for (local_28 = 0; *(long *)(*(long *)(nvalid + 0x20) + local_28 * 8) != 0;
            local_28 = local_28 + 1) {
        }
        if (**(ulong **)(nvalid + 8) < local_28) {
          printf("%s",*(undefined8 *)(*(long *)(nvalid + 0x20) + **(long **)(nvalid + 8) * 8));
        }
        else {
          printf("enum out of range: %lu",**(undefined8 **)(nvalid + 8));
        }
      }
      printf("\n");
    }
  }
  lotta_zeroes = mmap((void *)0x0,max_size,1,0x8022,-1,0);
  if (lotta_zeroes != (void *)0x0) {
    run_bench();
    return 0;
  }
  fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
          "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/benchmarks/bench_simul.c"
          ,0x2ca,"main");
  __stream = _stderr;
  piVar2 = __errno_location();
  pcVar3 = strerror(*piVar2);
  fprintf(__stream,"couldn\'t grab a zero buffer: mmap failed: %s",pcVar3);
  fprintf(_stderr,"\n");
  abort();
}

Assistant:

int
main(int argc, const char **argv)
{
	parse_args(argv + 1);

	if (!n_threads) {
		n_threads = (uint32_t)sysconf(_SC_NPROCESSORS_ONLN);
		if (n_threads > MAX_THREADS)
			n_threads = MAX_THREADS;
		if (!n_threads)
			UT_FATAL("can't obtain number of processor cores");
	}

	if (min_size > max_size)
		UT_FATAL("min_size > max_size");

	printf("Parameters:\n  %-20s : %s\n", "dir", dir);
	for (struct param_t *p = params; p->name; p++) {
		if (!p->var)
			continue;

		printf("  %-20s : ", p->name);
		if (p->enums) {
			uint64_t nvalid = 0;
			for (; p->enums[nvalid]; nvalid++)
				;

			if (*p->var < nvalid)
				printf("%s", p->enums[*p->var]);
			else
				printf("enum out of range: %lu", *p->var);
		} else
			print_units(*p->var);
		printf("\n");
	}

	lotta_zeroes = mmap(NULL, max_size, PROT_READ,
		MAP_PRIVATE | MAP_ANONYMOUS | MAP_POPULATE, -1, 0);
	if (!lotta_zeroes) {
		UT_FATAL("couldn't grab a zero buffer: mmap failed: %s",
			strerror(errno));
	}

	run_bench();

	return 0;
}